

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

byte_vec_t * sfc::read_binary(byte_vec_t *__return_storage_ptr__,string *path)

{
  byte bVar1;
  runtime_error *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  string_view fmt;
  format_args args;
  allocator<unsigned_char> local_329;
  undefined1 local_328 [12];
  undefined1 local_318 [12];
  undefined1 local_301;
  char *local_300;
  undefined8 local_2f8;
  string local_2f0;
  istream_type local_2c0 [8];
  ifstream ifs;
  string *path_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8 [3];
  undefined1 local_90 [16];
  v10 *local_80;
  char *local_78;
  string *local_70;
  char *local_68;
  undefined8 uStack_60;
  string *local_58;
  char **local_50;
  char *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  std::ifstream::ifstream(local_2c0,(string *)path,_S_bin);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_318,local_2c0);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_328);
    std::allocator<unsigned_char>::allocator(&local_329);
    __first._12_4_ = 0;
    __first._M_sbuf = (streambuf_type *)local_318._0_8_;
    __first._M_c = local_318._8_4_;
    __last._12_4_ = 0;
    __last._M_sbuf = (streambuf_type *)local_328._0_8_;
    __last._M_c = local_328._8_4_;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first
               ,__last,&local_329);
    std::allocator<unsigned_char>::~allocator(&local_329);
    std::ifstream::~ifstream(local_2c0);
    return __return_storage_ptr__;
  }
  local_301 = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_300 = "File \"{}\" could not be opened";
  local_2f8 = 0x1d;
  local_58 = &local_2f0;
  local_68 = "File \"{}\" could not be opened";
  uStack_60 = 0x1d;
  local_50 = &local_68;
  local_80 = (v10 *)0x1d075e;
  local_78 = (char *)0x1d;
  local_70 = path;
  local_48 = (char *)local_80;
  pcStack_40 = local_78;
  local_a8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                          ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)path,(v10 *)local_58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "File \"{}\" could not be opened");
  local_30 = local_90;
  local_38 = local_a8;
  local_18 = 0xd;
  fmt.size_ = 0xd;
  fmt.data_ = local_78;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_38;
  local_28 = local_38;
  local_20 = local_38;
  local_10 = local_30;
  ::fmt::v10::vformat_abi_cxx11_(&local_2f0,local_80,fmt,args);
  std::runtime_error::runtime_error(this,(string *)&local_2f0);
  local_301 = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline byte_vec_t read_binary(const std::string& path) {
  std::ifstream ifs(path, std::ios::binary);
  if (ifs.fail()) {
    throw std::runtime_error(fmt::format("File \"{}\" could not be opened", path));
  }
  return byte_vec_t((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
}